

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O1

Literals * wasm::Properties::getLiterals(Literals *__return_storage_ptr__,Expression *curr)

{
  uintptr_t uVar1;
  bool bVar2;
  ulong uVar3;
  initializer_list<wasm::Literal> init;
  Literal local_48;
  
  bVar2 = isSingleConstantExpression(curr);
  if (bVar2) {
    getLiteral(&local_48,curr);
    init._M_len = 1;
    init._M_array = &local_48;
    Literals::Literals(__return_storage_ptr__,init);
    Literal::~Literal(&local_48);
  }
  else {
    if (curr->_id != TupleMakeId) {
      handle_unreachable("non-constant expression",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/properties.h"
                         ,0x92);
    }
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 =
         0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar1 = curr[1].type.id;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if (curr[1].type.id <= uVar3) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        getLiteral(&local_48,*(Expression **)(*(long *)(curr + 1) + uVar3 * 8));
        SmallVector<wasm::Literal,_1UL>::push_back
                  (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,&local_48);
        Literal::~Literal(&local_48);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Literals getLiterals(const Expression* curr) {
  if (isSingleConstantExpression(curr)) {
    return {getLiteral(curr)};
  } else if (auto* tuple = curr->dynCast<TupleMake>()) {
    Literals literals;
    for (auto* op : tuple->operands) {
      literals.push_back(getLiteral(op));
    }
    return literals;
  } else {
    WASM_UNREACHABLE("non-constant expression");
  }
}